

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O0

string * __thiscall
cfd::core::ScriptOperator::ToString_abi_cxx11_(string *__return_storage_ptr__,ScriptOperator *this)

{
  bool bVar1;
  ulong uVar2;
  pointer ppVar3;
  allocator local_39;
  iterator local_38;
  _Rb_tree_const_iterator<std::pair<const_cfd::core::ScriptType,_cfd::core::ScriptOperator>_>
  local_30;
  iterator local_28;
  _Rb_tree_const_iterator<std::pair<const_cfd::core::ScriptType,_cfd::core::ScriptOperator>_>
  local_20;
  const_iterator ite;
  ScriptOperator *this_local;
  
  ite._M_node = (_Base_ptr)this;
  uVar2 = ::std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->text_data_);
  }
  else {
    bVar1 = ::std::
            map<cfd::core::ScriptType,_cfd::core::ScriptOperator,_std::less<cfd::core::ScriptType>,_std::allocator<std::pair<const_cfd::core::ScriptType,_cfd::core::ScriptOperator>_>_>
            ::empty((map<cfd::core::ScriptType,_cfd::core::ScriptOperator,_std::less<cfd::core::ScriptType>,_std::allocator<std::pair<const_cfd::core::ScriptType,_cfd::core::ScriptOperator>_>_>
                     *)g_operator_map);
    if (!bVar1) {
      local_28._M_node =
           (_Base_ptr)
           ::std::
           map<cfd::core::ScriptType,_cfd::core::ScriptOperator,_std::less<cfd::core::ScriptType>,_std::allocator<std::pair<const_cfd::core::ScriptType,_cfd::core::ScriptOperator>_>_>
           ::find((map<cfd::core::ScriptType,_cfd::core::ScriptOperator,_std::less<cfd::core::ScriptType>,_std::allocator<std::pair<const_cfd::core::ScriptType,_cfd::core::ScriptOperator>_>_>
                   *)g_operator_map,&this->data_type_);
      ::std::
      _Rb_tree_const_iterator<std::pair<const_cfd::core::ScriptType,_cfd::core::ScriptOperator>_>::
      _Rb_tree_const_iterator(&local_20,&local_28);
      local_38._M_node =
           (_Base_ptr)
           ::std::
           map<cfd::core::ScriptType,_cfd::core::ScriptOperator,_std::less<cfd::core::ScriptType>,_std::allocator<std::pair<const_cfd::core::ScriptType,_cfd::core::ScriptOperator>_>_>
           ::end((map<cfd::core::ScriptType,_cfd::core::ScriptOperator,_std::less<cfd::core::ScriptType>,_std::allocator<std::pair<const_cfd::core::ScriptType,_cfd::core::ScriptOperator>_>_>
                  *)g_operator_map);
      ::std::
      _Rb_tree_const_iterator<std::pair<const_cfd::core::ScriptType,_cfd::core::ScriptOperator>_>::
      _Rb_tree_const_iterator(&local_30,&local_38);
      bVar1 = ::std::operator!=(&local_20,&local_30);
      if (bVar1) {
        ppVar3 = ::std::
                 _Rb_tree_const_iterator<std::pair<const_cfd::core::ScriptType,_cfd::core::ScriptOperator>_>
                 ::operator->(&local_20);
        ToString_abi_cxx11_(__return_storage_ptr__,&ppVar3->second);
        return __return_storage_ptr__;
      }
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"UNKNOWN",&local_39);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ScriptOperator::ToString() const {
  if (text_data_.empty()) {
    if (!g_operator_map.empty()) {
      decltype(g_operator_map)::const_iterator ite =
          g_operator_map.find(data_type_);
      if (ite != g_operator_map.end()) {
        return ite->second.ToString();
      }
    }
    return "UNKNOWN";
  }
  return text_data_;
}